

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

void __thiscall QHostAddress::setAddress(QHostAddress *this,SpecialAddress address)

{
  long lVar1;
  QHostAddressPrivate *pQVar2;
  bool bVar3;
  quint8 qVar4;
  long in_FS_OFFSET;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  qVar4 = '\0';
  uVar5 = 0;
  switch(address) {
  case Null:
    break;
  case Broadcast:
    uVar5 = 0xffffffff;
    goto LAB_001add40;
  case LocalHost:
    uVar5 = 0x7f000001;
LAB_001add40:
    bVar3 = false;
LAB_001add4f:
    pQVar2 = (this->d).d.ptr;
    pQVar2->a = uVar5;
    pQVar2->protocol = '\0';
    (pQVar2->field_1).a6_64.c[0] = 0;
    if (bVar3) {
      (pQVar2->field_1).a6_64.c[1] = 0;
    }
    else {
      (pQVar2->field_1).a6_32.c[2] = 0xffff0000;
      (pQVar2->field_1).a6_32.c[3] =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    break;
  case LocalHostIPv6:
    qVar4 = '\x01';
  case AnyIPv6:
    pQVar2 = (this->d).d.ptr;
    pQVar2->protocol = '\x01';
    (pQVar2->field_1).a6_64.c[0] = 0;
    *(undefined8 *)((long)(pQVar2->field_1).a6_64.c + 7) = 0;
    (pQVar2->field_1).a6.c[0xf] = qVar4;
    pQVar2->a = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      convertToIpv4(&pQVar2->a,&(pQVar2->field_1).a6,(ConversionMode)0x5);
      return;
    }
    goto LAB_001add92;
  case Any:
    ((this->d).d.ptr)->protocol = '\x02';
    break;
  default:
    bVar3 = true;
    goto LAB_001add4f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_001add92:
  __stack_chk_fail();
}

Assistant:

void QHostAddress::setAddress(SpecialAddress address)
{
    clear();

    Q_IPV6ADDR ip6;
    memset(&ip6, 0, sizeof ip6);
    quint32 ip4 = INADDR_ANY;

    switch (address) {
    case Null:
        return;

    case Broadcast:
        ip4 = INADDR_BROADCAST;
        break;
    case LocalHost:
        ip4 = INADDR_LOOPBACK;
        break;
    case AnyIPv4:
        break;

    case LocalHostIPv6:
        ip6[15] = 1;
        Q_FALLTHROUGH();
    case AnyIPv6:
        d->setAddress(ip6);
        return;

    case Any:
        d->protocol = QHostAddress::AnyIPProtocol;
        return;
    }

    // common IPv4 part
    d->setAddress(ip4);
}